

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::block_is_loop_candidate(Compiler *this,SPIRBlock *block,Method method)

{
  uint uVar1;
  uint32_t uVar2;
  Variant *pVVar3;
  size_t sVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  SPIRBlock *pSVar8;
  SPIRBlock *pSVar9;
  SPIRBlock *pSVar10;
  ulong uVar11;
  SPIRBlock *to;
  uint uVar12;
  byte bVar13;
  long lVar14;
  byte bVar15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  
  if (block->disable_block_optimization != false) {
    return false;
  }
  if (block->complex_continue != false) {
    return false;
  }
  if (method != MergeToSelectContinueForLoop) {
    if (method == MergeToDirectForLoop) {
      if (*(int *)&(block->super_IVariant).field_0xc != 1) {
        return false;
      }
      if (block->merge != MergeLoop) {
        return false;
      }
      bVar5 = block_is_noop(this,block);
      if (!bVar5) {
        return false;
      }
      pSVar8 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (block->next_block).id);
      uVar7 = (ulong)(pSVar8->false_block).id;
      uVar11 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
      if ((uVar7 < uVar11) &&
         (pVVar3 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
         pVVar3[uVar7].type == TypeBlock)) {
        pSVar9 = Variant::get<spirv_cross::SPIRBlock>(pVVar3 + uVar7);
        uVar11 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
      }
      else {
        pSVar9 = (SPIRBlock *)0x0;
      }
      uVar7 = (ulong)(pSVar8->true_block).id;
      if ((uVar7 < uVar11) &&
         (pVVar3 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
         pVVar3[uVar7].type == TypeBlock)) {
        pSVar10 = Variant::get<spirv_cross::SPIRBlock>(pVVar3 + uVar7);
        uVar11 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
      }
      else {
        pSVar10 = (SPIRBlock *)0x0;
      }
      uVar6 = (block->merge_block).id;
      uVar7 = (ulong)uVar6;
      if ((uVar7 < uVar11) &&
         (pVVar3 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
         pVVar3[uVar7].type == TypeBlock)) {
        to = Variant::get<spirv_cross::SPIRBlock>(pVVar3 + uVar7);
        uVar6 = (block->merge_block).id;
      }
      else {
        to = (SPIRBlock *)0x0;
      }
      bVar5 = true;
      if ((pSVar8->false_block).id == uVar6) {
        bVar17 = true;
      }
      else {
        bVar17 = false;
        if ((pSVar9 != (SPIRBlock *)0x0) && (bVar17 = false, to != (SPIRBlock *)0x0)) {
          bVar17 = execution_is_noop(this,pSVar9,to);
          uVar6 = (block->merge_block).id;
        }
      }
      uVar12 = (pSVar8->true_block).id;
      if (uVar12 != uVar6) {
        bVar5 = false;
        if ((pSVar10 != (SPIRBlock *)0x0) && (bVar5 = false, to != (SPIRBlock *)0x0)) {
          bVar5 = execution_is_noop(this,pSVar10,to);
          uVar12 = (pSVar8->true_block).id;
          uVar6 = (block->merge_block).id;
        }
        if (uVar12 != uVar6) {
          bVar15 = bVar17 & uVar12 != (block->super_IVariant).self.id;
          goto LAB_0028d754;
        }
      }
      bVar15 = 0;
LAB_0028d754:
      uVar12 = (pSVar8->false_block).id;
      if (uVar12 == uVar6) {
        bVar16 = 0;
      }
      else {
        bVar16 = bVar5 & uVar12 != (block->super_IVariant).self.id;
      }
      if (*(int *)&(pSVar8->super_IVariant).field_0xc != 2) {
        return false;
      }
      if (pSVar8->merge != MergeNone) {
        return false;
      }
      if (bVar15 != 0 || bVar16 != 0) {
        uVar11 = (ulong)uVar6;
        if ((this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar11) {
          return true;
        }
        pVVar3 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar3[uVar11].type == TypeBlock) {
          pSVar9 = Variant::get<spirv_cross::SPIRBlock>(pVVar3 + uVar11);
          sVar4 = (pSVar9->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size;
          if (sVar4 == 0) {
            return true;
          }
          lVar14 = 0;
          do {
            uVar2 = *(uint32_t *)
                     ((long)&(((pSVar9->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>
                              .ptr)->parent).id + lVar14);
            bVar17 = uVar2 != (block->super_IVariant).self.id;
            bVar18 = uVar2 != (pSVar8->false_block).id;
            bVar5 = bVar18 && bVar17;
            if (!bVar18 || !bVar17) {
              return bVar5;
            }
            bVar17 = sVar4 * 0xc + -0xc != lVar14;
            lVar14 = lVar14 + 0xc;
          } while (bVar17);
          return bVar5;
        }
        return true;
      }
      return false;
    }
    if (method != MergeToSelectForLoop) {
      return false;
    }
  }
  uVar7 = (ulong)(block->false_block).id;
  uVar11 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
  if ((uVar7 < uVar11) &&
     (pVVar3 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar3[uVar7].type == TypeBlock)) {
    pSVar8 = Variant::get<spirv_cross::SPIRBlock>(pVVar3 + uVar7);
    uVar11 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
  }
  else {
    pSVar8 = (SPIRBlock *)0x0;
  }
  uVar7 = (ulong)(block->true_block).id;
  if ((uVar7 < uVar11) &&
     (pVVar3 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar3[uVar7].type == TypeBlock)) {
    pSVar9 = Variant::get<spirv_cross::SPIRBlock>(pVVar3 + uVar7);
    uVar11 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
  }
  else {
    pSVar9 = (SPIRBlock *)0x0;
  }
  uVar6 = (block->merge_block).id;
  uVar7 = (ulong)uVar6;
  if ((uVar7 < uVar11) &&
     (pVVar3 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar3[uVar7].type == TypeBlock)) {
    pSVar10 = Variant::get<spirv_cross::SPIRBlock>(pVVar3 + uVar7);
    uVar6 = (block->merge_block).id;
  }
  else {
    pSVar10 = (SPIRBlock *)0x0;
  }
  bVar5 = true;
  if ((block->false_block).id == uVar6) {
    bVar17 = true;
  }
  else {
    bVar17 = false;
    if ((pSVar8 != (SPIRBlock *)0x0) && (bVar17 = false, pSVar10 != (SPIRBlock *)0x0)) {
      bVar17 = execution_is_noop(this,pSVar8,pSVar10);
      uVar6 = (block->merge_block).id;
    }
  }
  uVar12 = (block->true_block).id;
  if (uVar12 == uVar6) {
    bVar15 = 0;
    uVar12 = uVar6;
  }
  else {
    bVar5 = false;
    if ((pSVar9 != (SPIRBlock *)0x0) && (bVar5 = false, pSVar10 != (SPIRBlock *)0x0)) {
      bVar5 = execution_is_noop(this,pSVar9,pSVar10);
      uVar6 = (block->merge_block).id;
      uVar12 = (block->true_block).id;
    }
    if (uVar12 == uVar6) {
      bVar15 = 0;
    }
    else {
      bVar15 = bVar17 & uVar12 != (block->super_IVariant).self.id;
    }
  }
  uVar1 = (block->false_block).id;
  if (uVar1 == uVar6) {
    bVar16 = 0;
  }
  else {
    bVar16 = bVar5 & uVar1 != (block->super_IVariant).self.id;
  }
  bVar13 = (bVar15 | bVar16) &
           (block->merge == MergeLoop && *(int *)&(block->super_IVariant).field_0xc == 2);
  if ((bVar15 == 1 && method == MergeToSelectContinueForLoop) && (bVar13 != 0)) {
    if (uVar12 == (block->continue_block).id) goto LAB_0028d5d3;
  }
  else if ((method == MergeToSelectContinueForLoop & bVar16 & bVar13) == 1) {
    if (uVar1 == (block->continue_block).id) {
LAB_0028d5d3:
      sVar4 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size;
      if (sVar4 != 0) {
        lVar14 = 0;
        do {
          if (*(uint32_t *)
               ((long)&(((block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr)->
                       parent).id + lVar14) == (block->super_IVariant).self.id) {
            return false;
          }
          lVar14 = lVar14 + 0xc;
        } while (sVar4 * 0xc != lVar14);
      }
      uVar11 = (ulong)uVar6;
      if ((this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar11) {
        return true;
      }
      pVVar3 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[uVar11].type != TypeBlock) {
        return true;
      }
      pSVar8 = Variant::get<spirv_cross::SPIRBlock>(pVVar3 + uVar11);
      sVar4 = (pSVar8->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size;
      if (sVar4 != 0) {
        lVar14 = 0;
        do {
          bVar17 = *(uint32_t *)
                    ((long)&(((pSVar8->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.
                             ptr)->parent).id + lVar14) == (block->super_IVariant).self.id;
          bVar5 = !bVar17;
          if (bVar17) {
            return bVar5;
          }
          bVar17 = sVar4 * 0xc + -0xc != lVar14;
          lVar14 = lVar14 + 0xc;
        } while (bVar17);
        return bVar5;
      }
      return true;
    }
  }
  else if (bVar13 != 0) goto LAB_0028d5d3;
  return false;
}

Assistant:

bool Compiler::block_is_loop_candidate(const SPIRBlock &block, SPIRBlock::Method method) const
{
	// Tried and failed.
	if (block.disable_block_optimization || block.complex_continue)
		return false;

	if (method == SPIRBlock::MergeToSelectForLoop || method == SPIRBlock::MergeToSelectContinueForLoop)
	{
		// Try to detect common for loop pattern
		// which the code backend can use to create cleaner code.
		// for(;;) { if (cond) { some_body; } else { break; } }
		// is the pattern we're looking for.
		const auto *false_block = maybe_get<SPIRBlock>(block.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(block.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(block.merge_block);

		bool false_block_is_merge = block.false_block == block.merge_block ||
		                            (false_block && merge_block && execution_is_noop(*false_block, *merge_block));

		bool true_block_is_merge = block.true_block == block.merge_block ||
		                           (true_block && merge_block && execution_is_noop(*true_block, *merge_block));

		bool positive_candidate =
		    block.true_block != block.merge_block && block.true_block != block.self && false_block_is_merge;

		bool negative_candidate =
		    block.false_block != block.merge_block && block.false_block != block.self && true_block_is_merge;

		bool ret = block.terminator == SPIRBlock::Select && block.merge == SPIRBlock::MergeLoop &&
		           (positive_candidate || negative_candidate);

		if (ret && positive_candidate && method == SPIRBlock::MergeToSelectContinueForLoop)
			ret = block.true_block == block.continue_block;
		else if (ret && negative_candidate && method == SPIRBlock::MergeToSelectContinueForLoop)
			ret = block.false_block == block.continue_block;

		// If we have OpPhi which depends on branches which came from our own block,
		// we need to flush phi variables in else block instead of a trivial break,
		// so we cannot assume this is a for loop candidate.
		if (ret)
		{
			for (auto &phi : block.phi_variables)
				if (phi.parent == block.self)
					return false;

			auto *merge = maybe_get<SPIRBlock>(block.merge_block);
			if (merge)
				for (auto &phi : merge->phi_variables)
					if (phi.parent == block.self)
						return false;
		}
		return ret;
	}
	else if (method == SPIRBlock::MergeToDirectForLoop)
	{
		// Empty loop header that just sets up merge target
		// and branches to loop body.
		bool ret = block.terminator == SPIRBlock::Direct && block.merge == SPIRBlock::MergeLoop && block_is_noop(block);

		if (!ret)
			return false;

		auto &child = get<SPIRBlock>(block.next_block);

		const auto *false_block = maybe_get<SPIRBlock>(child.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(child.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(block.merge_block);

		bool false_block_is_merge = child.false_block == block.merge_block ||
		                            (false_block && merge_block && execution_is_noop(*false_block, *merge_block));

		bool true_block_is_merge = child.true_block == block.merge_block ||
		                           (true_block && merge_block && execution_is_noop(*true_block, *merge_block));

		bool positive_candidate =
		    child.true_block != block.merge_block && child.true_block != block.self && false_block_is_merge;

		bool negative_candidate =
		    child.false_block != block.merge_block && child.false_block != block.self && true_block_is_merge;

		ret = child.terminator == SPIRBlock::Select && child.merge == SPIRBlock::MergeNone &&
		      (positive_candidate || negative_candidate);

		if (ret)
		{
			auto *merge = maybe_get<SPIRBlock>(block.merge_block);
			if (merge)
				for (auto &phi : merge->phi_variables)
					if (phi.parent == block.self || phi.parent == child.false_block)
						return false;
		}

		return ret;
	}
	else
		return false;
}